

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_platform.cpp
# Opt level: O0

char * crnlib_strnlwr(char *p,size_t n)

{
  int iVar1;
  ulong in_RSI;
  char *in_RDI;
  bool bVar2;
  char c;
  size_t i;
  char *q;
  ulong local_20;
  char *local_18;
  
  local_20 = 0;
  local_18 = in_RDI;
  while( true ) {
    bVar2 = false;
    if (local_20 < in_RSI) {
      bVar2 = *local_18 != '\0';
    }
    if (!bVar2) break;
    iVar1 = tolower((int)*local_18);
    *local_18 = (char)iVar1;
    local_20 = local_20 + 1;
    local_18 = local_18 + 1;
  }
  return in_RDI;
}

Assistant:

char* crnlib_strnlwr(char* p, size_t n) {
  char* q = p;
  for (size_t i = 0; i < n && *q; i++) {
    char c = *q;
    *q++ = tolower(c);
  }
  return p;
}